

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O1

ngx_int_t ngx_http_ssi_evaluate_string
                    (ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t *text,ngx_uint_t flags)

{
  u_char *puVar1;
  byte bVar2;
  ngx_buf_t *pnVar3;
  bool bVar4;
  ngx_uint_t nVar5;
  ngx_str_t *pnVar6;
  ngx_http_variable_value_t *pnVar7;
  size_t *psVar8;
  undefined8 *puVar9;
  u_char *puVar10;
  char *fmt;
  ngx_buf_t *pnVar11;
  ngx_buf_t *pnVar12;
  ngx_log_t *log;
  byte *pbVar13;
  long lVar14;
  byte *pbVar15;
  size_t sVar16;
  ngx_buf_t *pnVar17;
  undefined1 local_a8 [8];
  ngx_array_t lengths;
  ngx_array_t values;
  undefined1 local_50 [8];
  ngx_str_t var;
  ngx_buf_t *local_38;
  
  nVar5 = ngx_http_script_variables_count((ngx_str_t *)ctx);
  if (nVar5 == 0) {
    pbVar13 = ctx->pos;
    pbVar15 = pbVar13;
    if (((((ulong)text & 1) != 0) && (*pbVar13 != 0x2f)) && (sVar16 = (r->uri).len, sVar16 != 0)) {
      puVar10 = (r->uri).data + sVar16;
      lVar14 = -sVar16;
      do {
        puVar10 = puVar10 + -1;
        if (*puVar10 == '/') {
          pbVar15 = (byte *)ngx_pnalloc(r->pool,(long)ctx->buf - lVar14);
          if (pbVar15 == (byte *)0x0) {
            return -1;
          }
          memcpy(pbVar15,(r->uri).data,-lVar14);
          pbVar13 = pbVar15 + -lVar14;
          break;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
    }
    if (ctx->buf != (ngx_buf_t *)0x0) {
      bVar4 = false;
      pnVar11 = (ngx_buf_t *)0x0;
      do {
        bVar2 = ctx->pos[(long)pnVar11];
        if (bVar4) {
          if ((0x3a < bVar2 - 0x22) ||
             ((0x400000000000025U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)) {
            *pbVar13 = 0x5c;
            pbVar13 = pbVar13 + 1;
          }
LAB_0015e9b6:
          *pbVar13 = bVar2;
          pbVar13 = pbVar13 + 1;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (bVar2 != 0x5c) goto LAB_0015e9b6;
        }
        pnVar11 = (ngx_buf_t *)((long)&pnVar11->pos + 1);
      } while (pnVar11 < ctx->buf);
    }
    ctx->buf = (ngx_buf_t *)(pbVar13 + -(long)pbVar15);
    ctx->pos = pbVar15;
  }
  else {
    lengths.nalloc = (ngx_uint_t)r->pool;
    lengths.elts = (void *)0x0;
    lengths.nelts = 8;
    lengths.size = 8;
    local_a8 = (undefined1  [8])ngx_palloc((ngx_pool_t *)lengths.nalloc,0x40);
    if (local_a8 == (undefined1  [8])0x0) {
      return -1;
    }
    lengths.pool = (ngx_pool_t *)ngx_palloc(r->pool,0x40);
    if (lengths.pool == (ngx_pool_t *)0x0) {
      return -1;
    }
    local_38 = (ngx_buf_t *)0x0;
    pnVar11 = (ngx_buf_t *)0x0;
    while (pnVar3 = ctx->buf, pnVar11 < pnVar3) {
      puVar10 = ctx->pos;
      if (puVar10[(long)pnVar11] != '$') {
        pbVar13 = puVar10 + (long)pnVar11;
        pbVar15 = pbVar13;
        if (pnVar11 < ctx->buf) {
          bVar4 = false;
          do {
            bVar2 = ctx->pos[(long)pnVar11];
            if (bVar4) {
              if ((0x3a < bVar2 - 0x22) ||
                 ((0x400000000000025U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)) {
                *pbVar15 = 0x5c;
                pbVar15 = pbVar15 + 1;
              }
LAB_0015e8d8:
              *pbVar15 = bVar2;
              pbVar15 = pbVar15 + 1;
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if (bVar2 != 0x5c) {
                if (bVar2 != 0x24) goto LAB_0015e8d8;
                break;
              }
            }
            pnVar11 = (ngx_buf_t *)((long)&pnVar11->pos + 1);
          } while (pnVar11 < ctx->buf);
        }
        sVar16 = (long)pbVar15 - (long)pbVar13;
        goto LAB_0015e8fa;
      }
      local_50 = (undefined1  [8])0x0;
      pnVar17 = (ngx_buf_t *)((long)&pnVar11->pos + 1);
      if (pnVar17 == pnVar3) {
LAB_0015e9d7:
        log = r->connection->log;
        if (log->log_level < 4) {
          return 1;
        }
        fmt = "invalid variable name in \"%V\"";
LAB_0015ea62:
        ngx_log_error_core(4,log,0,fmt,ctx);
        return 1;
      }
      puVar1 = puVar10 + (long)pnVar17;
      if (*puVar1 == '{') {
        pnVar17 = (ngx_buf_t *)((long)&pnVar11->pos + 2);
        if (pnVar17 == pnVar3) goto LAB_0015e9d7;
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      var.len = (long)puVar10 + (long)pnVar17;
      pnVar11 = pnVar17;
      if (pnVar17 < pnVar3) {
        while( true ) {
          pnVar12 = (ngx_buf_t *)((long)(u_char **)local_50 + 1);
          bVar2 = puVar10[(long)pnVar17];
          if ((*puVar1 == '{') && (bVar2 == 0x7d)) break;
          if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) &&
              (pnVar11 = pnVar17, bVar2 != 0x5f && 9 < (byte)(bVar2 - 0x30))) ||
             (pnVar17 = (ngx_buf_t *)((long)&pnVar17->pos + 1), pnVar11 = pnVar3,
             local_50 = (undefined1  [8])pnVar12, pnVar3 == pnVar17)) goto LAB_0015e81c;
        }
        bVar4 = false;
        pnVar11 = (ngx_buf_t *)((long)&pnVar17->pos + 1);
      }
LAB_0015e81c:
      if (bVar4) {
        log = r->connection->log;
        if (log->log_level < 4) {
          return 1;
        }
        fmt = "the closing bracket in \"%V\" variable is missing";
        ctx = (ngx_http_ssi_ctx_t *)local_50;
        goto LAB_0015ea62;
      }
      if (local_50 == (undefined1  [8])0x0) goto LAB_0015e9d7;
      nVar5 = ngx_hash_strlow((u_char *)var.len,(u_char *)var.len,(size_t)local_50);
      pnVar6 = ngx_http_ssi_get_variable(r,(ngx_str_t *)local_50,nVar5);
      if (pnVar6 != (ngx_str_t *)0x0) {
        sVar16 = pnVar6->len;
        pbVar13 = pnVar6->data;
        goto LAB_0015e8fa;
      }
      pnVar7 = ngx_http_get_variable(r,(ngx_str_t *)local_50,nVar5);
      if (pnVar7 == (ngx_http_variable_value_t *)0x0) {
        return -1;
      }
      if ((*(uint *)pnVar7 >> 0x1e & 1) == 0) {
        pbVar13 = pnVar7->data;
        sVar16 = (size_t)(*(uint *)pnVar7 & 0xfffffff);
LAB_0015e8fa:
        psVar8 = (size_t *)ngx_array_push((ngx_array_t *)local_a8);
        if (psVar8 == (size_t *)0x0) {
          return -1;
        }
        *psVar8 = sVar16;
        puVar9 = (undefined8 *)ngx_array_push((ngx_array_t *)&lengths.pool);
        if (puVar9 == (undefined8 *)0x0) {
          return -1;
        }
        local_38 = (ngx_buf_t *)((long)&local_38->pos + sVar16);
        *puVar9 = pbVar13;
      }
    }
    var.data = (u_char *)0x0;
    values.pool._0_4_ = (uint)text;
    puVar10 = (u_char *)
              ngx_pnalloc(r->pool,(long)&local_38->pos + (ulong)(((uint)values.pool >> 1 & 1) != 0))
    ;
    if (puVar10 == (u_char *)0x0) {
      return -1;
    }
    ctx->buf = local_38;
    ctx->pos = puVar10;
    memcpy(puVar10,(r->uri).data,(size_t)var.data);
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_ssi_evaluate_string(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t *text, ngx_uint_t flags)
{
    u_char                      ch, *p, **value, *data, *part_data;
    size_t                     *size, len, prefix, part_len;
    ngx_str_t                   var, *val;
    ngx_int_t                   key;
    ngx_uint_t                  i, n, bracket, quoted;
    ngx_array_t                 lengths, values;
    ngx_http_variable_value_t  *vv;

    n = ngx_http_script_variables_count(text);

    if (n == 0) {

        data = text->data;
        p = data;

        if ((flags & NGX_HTTP_SSI_ADD_PREFIX) && text->data[0] != '/') {

            for (prefix = r->uri.len; prefix; prefix--) {
                if (r->uri.data[prefix - 1] == '/') {
                    break;
                }
            }

            if (prefix) {
                len = prefix + text->len;

                data = ngx_pnalloc(r->pool, len);
                if (data == NULL) {
                    return NGX_ERROR;
                }

                p = ngx_copy(data, r->uri.data, prefix);
            }
        }

        quoted = 0;

        for (i = 0; i < text->len; i++) {
            ch = text->data[i];

            if (!quoted) {

                if (ch == '\\') {
                    quoted = 1;
                    continue;
                }

            } else {
                quoted = 0;

                if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                    *p++ = '\\';
                }
            }

            *p++ = ch;
        }

        text->len = p - data;
        text->data = data;

        return NGX_OK;
    }

    if (ngx_array_init(&lengths, r->pool, 8, sizeof(size_t *)) != NGX_OK) {
        return NGX_ERROR;
    }

    if (ngx_array_init(&values, r->pool, 8, sizeof(u_char *)) != NGX_OK) {
        return NGX_ERROR;
    }

    len = 0;
    i = 0;

    while (i < text->len) {

        if (text->data[i] == '$') {

            var.len = 0;

            if (++i == text->len) {
                goto invalid_variable;
            }

            if (text->data[i] == '{') {
                bracket = 1;

                if (++i == text->len) {
                    goto invalid_variable;
                }

                var.data = &text->data[i];

            } else {
                bracket = 0;
                var.data = &text->data[i];
            }

            for ( /* void */ ; i < text->len; i++, var.len++) {
                ch = text->data[i];

                if (ch == '}' && bracket) {
                    i++;
                    bracket = 0;
                    break;
                }

                if ((ch >= 'A' && ch <= 'Z')
                    || (ch >= 'a' && ch <= 'z')
                    || (ch >= '0' && ch <= '9')
                    || ch == '_')
                {
                    continue;
                }

                break;
            }

            if (bracket) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "the closing bracket in \"%V\" "
                              "variable is missing", &var);
                return NGX_HTTP_SSI_ERROR;
            }

            if (var.len == 0) {
                goto invalid_variable;
            }

            key = ngx_hash_strlow(var.data, var.data, var.len);

            val = ngx_http_ssi_get_variable(r, &var, key);

            if (val == NULL) {
                vv = ngx_http_get_variable(r, &var, key);
                if (vv == NULL) {
                    return NGX_ERROR;
                }

                if (vv->not_found) {
                    continue;
                }

                part_data = vv->data;
                part_len = vv->len;

            } else {
                part_data = val->data;
                part_len = val->len;
            }

        } else {
            part_data = &text->data[i];
            quoted = 0;

            for (p = part_data; i < text->len; i++) {
                ch = text->data[i];

                if (!quoted) {

                    if (ch == '\\') {
                        quoted = 1;
                        continue;
                    }

                    if (ch == '$') {
                        break;
                    }

                } else {
                    quoted = 0;

                    if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                        *p++ = '\\';
                    }
                }

                *p++ = ch;
            }

            part_len = p - part_data;
        }

        len += part_len;

        size = ngx_array_push(&lengths);
        if (size == NULL) {
            return NGX_ERROR;
        }

        *size = part_len;

        value = ngx_array_push(&values);
        if (value == NULL) {
            return NGX_ERROR;
        }

        *value = part_data;
    }

    prefix = 0;

    size = lengths.elts;
    value = values.elts;

    if (flags & NGX_HTTP_SSI_ADD_PREFIX) {
        for (i = 0; i < values.nelts; i++) {
            if (size[i] != 0) {
                if (*value[i] != '/') {
                    for (prefix = r->uri.len; prefix; prefix--) {
                        if (r->uri.data[prefix - 1] == '/') {
                            len += prefix;
                            break;
                        }
                    }
                }

                break;
            }
        }
    }

    p = ngx_pnalloc(r->pool, len + ((flags & NGX_HTTP_SSI_ADD_ZERO) ? 1 : 0));
    if (p == NULL) {
        return NGX_ERROR;
    }

    text->len = len;
    text->data = p;

    p = ngx_copy(p, r->uri.data, prefix);

    for (i = 0; i < values.nelts; i++) {
        p = ngx_copy(p, value[i], size[i]);
    }

    return NGX_OK;

invalid_variable:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid variable name in \"%V\"", text);

    return NGX_HTTP_SSI_ERROR;
}